

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_userauth_publickey
              (LIBSSH2_SESSION *session,char *user,uchar *pubkeydata,size_t pubkeydata_len,
              _func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_void_ptr_ptr
              *sign_callback,void **abstract)

{
  time_t start_time;
  size_t username_len;
  time_t entry_time;
  int rc;
  void **abstract_local;
  _func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_void_ptr_ptr
  *sign_callback_local;
  size_t pubkeydata_len_local;
  uchar *pubkeydata_local;
  char *user_local;
  LIBSSH2_SESSION *session_local;
  
  if (session == (LIBSSH2_SESSION *)0x0) {
    session_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      username_len = strlen(user);
      entry_time._4_4_ =
           _libssh2_userauth_publickey
                     (session,user,username_len,pubkeydata,pubkeydata_len,sign_callback,abstract);
      if (((entry_time._4_4_ != -0x25) || (session == (LIBSSH2_SESSION *)0x0)) ||
         (session->api_block_mode == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(session,start_time);
    } while (entry_time._4_4_ == 0);
    session_local._4_4_ = entry_time._4_4_;
  }
  return session_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_publickey(LIBSSH2_SESSION *session,
                           const char *user,
                           const unsigned char *pubkeydata,
                           size_t pubkeydata_len,
                           LIBSSH2_USERAUTH_PUBLICKEY_SIGN_FUNC
                               ((*sign_callback)),
                           void **abstract)
{
    int rc;

    if(!session)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, session,
                 _libssh2_userauth_publickey(session, user, strlen(user),
                                             pubkeydata, pubkeydata_len,
                                             sign_callback, abstract));
    return rc;
}